

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuregistrarproxy_p.h
# Opt level: O3

QDBusReply<QString> * __thiscall
QDBusMenuRegistrarInterface::GetMenuForWindow
          (QDBusReply<QString> *__return_storage_ptr__,QDBusMenuRegistrarInterface *this,
          uint windowId,QDBusObjectPath *menuObjectPath)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  long in_FS_OFFSET;
  QDBusMessage reply;
  QDBusObjectPath local_78;
  QArrayDataPointer<QVariant> local_58;
  undefined1 *local_38;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QVariant *)0x6ca6b2;
  local_58.size = 0x10;
  local_2c = windowId;
  QDBusAbstractInterface::call<unsigned_int&>
            ((QDBusAbstractInterface *)&local_38,(CallMode)this,(QString *)0x1,(uint *)&local_58);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusMessage::arguments();
  iVar4 = QDBusMessage::type();
  if ((iVar4 == 2) && ((undefined1 *)local_58.size == (undefined1 *)0x2)) {
    qdbus_cast<QDBusObjectPath>(&local_78,local_58.ptr + 1);
    pQVar1 = &((menuObjectPath->m_path).d.d)->super_QArrayData;
    pcVar2 = (menuObjectPath->m_path).d.ptr;
    (menuObjectPath->m_path).d.d = local_78.m_path.d.d;
    (menuObjectPath->m_path).d.ptr = local_78.m_path.d.ptr;
    qVar3 = (menuObjectPath->m_path).d.size;
    (menuObjectPath->m_path).d.size = local_78.m_path.d.size;
    local_78.m_path.d.d = (Data *)pQVar1;
    local_78.m_path.d.ptr = pcVar2;
    local_78.m_path.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QDBusError::QDBusError(&__return_storage_ptr__->m_error);
  (__return_storage_ptr__->m_data).d.d = (Data *)0x0;
  (__return_storage_ptr__->m_data).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->m_data).d.size = 0;
  QDBusReply<QString>::operator=(__return_storage_ptr__,(QDBusMessage *)&local_38);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_58);
  QDBusMessage::~QDBusMessage((QDBusMessage *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDBusReply<QString> GetMenuForWindow(uint windowId, QDBusObjectPath &menuObjectPath)
    {
        QDBusMessage reply = call(QDBus::Block, QStringLiteral("GetMenuForWindow"), windowId);
        QList<QVariant> arguments = reply.arguments();
        if (reply.type() == QDBusMessage::ReplyMessage && arguments.size() == 2)
            menuObjectPath = qdbus_cast<QDBusObjectPath>(arguments.at(1));
        return reply;
    }